

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O3

size_t __thiscall shine::http::response::decode_header(response *this,int8 *data_,size_t len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  entry_t entry;
  entry_t local_80;
  size_t local_40;
  vector<shine::http::entry_t,std::allocator<shine::http::entry_t>> *local_38;
  
  pcVar3 = strstr(data_,"\r\n\r\n");
  if ((pcVar3 != (char *)0x0) && (pcVar4 = strchr(data_,0x20), pcVar4 != (char *)0x0)) {
    std::__cxx11::string::_M_replace
              ((ulong)this,0,(char *)(this->super_header)._version.super_string._M_string_length,
               (ulong)data_);
    pcVar5 = strchr(pcVar4 + 1,0x20);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      iVar2 = atoi(pcVar4 + 1);
      this->_status_code = (uint16)iVar2;
      pcVar4 = strstr(pcVar5 + 1,"\r\n");
      if (pcVar4 != (char *)0x0) {
        local_40 = len;
        std::__cxx11::string::_M_replace
                  ((ulong)&this->_status_desc,0,
                   (char *)(this->_status_desc).super_string._M_string_length,(ulong)(pcVar5 + 1));
        pcVar4 = pcVar4 + 2;
        paVar1 = &local_80._key.super_string.field_2;
        local_38 = (vector<shine::http::entry_t,std::allocator<shine::http::entry_t>> *)
                   &(this->super_header)._entrys;
        do {
          if (pcVar3 + 2 <= pcVar4) {
            return local_40;
          }
          local_80._key.super_string._M_string_length = 0;
          local_80._key.super_string.field_2._M_local_buf[0] = '\0';
          local_80._value.super_string._M_dataplus._M_p =
               (pointer)&local_80._value.super_string.field_2;
          local_80._value.super_string._M_string_length = 0;
          local_80._value.super_string.field_2._M_local_buf[0] = '\0';
          local_80._key.super_string._M_dataplus._M_p = (pointer)paVar1;
          pcVar5 = strstr(pcVar4,": ");
          if (pcVar5 != (char *)0x0) {
            std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar4);
            pcVar4 = strstr(pcVar5 + 2,"\r\n");
            std::__cxx11::string::_M_replace
                      ((ulong)&local_80._value,0,
                       (char *)local_80._value.super_string._M_string_length,(ulong)(pcVar5 + 2));
            pcVar4 = pcVar4 + 2;
            iVar2 = std::__cxx11::string::compare((char *)&local_80);
            if (iVar2 == 0) {
              sVar6 = atoll(local_80._value.super_string._M_dataplus._M_p);
              (this->super_header)._content_length = sVar6;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_80);
              if ((iVar2 == 0) &&
                 (iVar2 = std::__cxx11::string::compare((char *)&local_80._value), iVar2 == 0)) {
                this->_is_chunk = true;
              }
              else {
                std::vector<shine::http::entry_t,std::allocator<shine::http::entry_t>>::
                emplace_back<shine::http::entry_t&>(local_38,&local_80);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._value.super_string._M_dataplus._M_p !=
              &local_80._value.super_string.field_2) {
            operator_delete(local_80._value.super_string._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._key.super_string._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._key.super_string._M_dataplus._M_p);
          }
        } while (pcVar5 != (char *)0x0);
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t decode_header(const int8 *data_, size_t len)
            {
                int8 *data = (int8*)data_;
                int8 *header_end = strstr(data, "\r\n\r\n");
                if (header_end == NULL)
                    return -1;

                //decode version status code status desc
                int8 *tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                get_version().assign(data, tmp - data);
                data = tmp + 1;

                tmp = strstr(data, " ");
                if (tmp == NULL)
                    return -1;

                *tmp = '\0';
                get_status_code() = atoi(data);
                data = tmp + 1;

                tmp = strstr(data, "\r\n");
                if (tmp == NULL)
                    return -1;

                get_status_desc().assign(data, tmp - data);
                data = tmp + 2;

                //decode other entrys
                while (data < header_end + 2)
                {
                    entry_t entry;
                    tmp = strstr(data, ": ");
                    if (tmp == NULL)
                        return -1;

                    entry.get_key().assign(data, tmp - data);
                    data = tmp + 2;

                    tmp = strstr(data, "\r\n");
                    entry.get_value().assign(data, tmp - data);
                    data = tmp + 2;

					if (entry.get_key() == "Content-Length")
						get_content_length() = entry.get_value().to_uint64();
					else if (entry.get_key() == "Transfer-Encoding" && entry.get_value() == "chunked")
						set_is_chunk(true);
                    else
                        add_entry(std::move(entry));
                }

                return len;
            }